

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O2

bool __thiscall
slang::parsing::Preprocessor::expandMacro
          (Preprocessor *this,MacroDef macro,MacroExpansion *expansion,
          MacroActualArgumentListSyntax *actualArgs)

{
  group_type_pointer pgVar1;
  SourceManager *this_00;
  BumpAllocator *pBVar2;
  uint uVar3;
  undefined2 uVar4;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined4 uVar9;
  Token sourceToken;
  Token token_00;
  Preprocessor *pPVar10;
  undefined8 this_01;
  group_type_pointer pgVar11;
  value_type_pointer ppVar12;
  arrays_type *paVar13;
  bool bVar14;
  byte bVar15;
  bool bVar16;
  uint uVar17;
  int iVar18;
  SourceLocation SVar19;
  MacroFormalArgumentSyntax *pMVar20;
  MacroActualArgumentSyntax *pMVar21;
  uint64_t hash;
  size_type __n;
  undefined4 extraout_var;
  ulong uVar22;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  ulong index;
  pointer pTVar23;
  TokenList *pTVar24;
  arrays_type *arrays_;
  DefineDirectiveSyntax *pDVar25;
  arrays_type *paVar26;
  EVP_PKEY_CTX *ctx;
  ulong uVar27;
  anon_class_64_8_ed10e8cd *in_R9;
  MacroFormalArgumentListSyntax *pMVar28;
  pointer pTVar29;
  Token *pTVar30;
  pointer pTVar31;
  long lVar32;
  undefined1 auVar33 [16];
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  byte bVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  byte bVar41;
  uchar uVar42;
  uchar uVar43;
  uchar uVar44;
  byte bVar45;
  uchar uVar46;
  uchar uVar47;
  uchar uVar48;
  byte bVar49;
  string_view sVar50;
  SourceRange SVar51;
  basic_string_view<char,_std::char_traits<char>_> rawText;
  Token TVar52;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  bool inDefineDirective;
  Token token;
  Token empty;
  SourceRange expansionRange;
  string_view name;
  SourceLocation start;
  Token endOfArgs;
  SourceLocation expansionLoc_1;
  SourceLocation expansionLoc;
  anon_class_64_8_ed10e8cd handleToken;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
  argumentMap;
  anon_class_32_4_0a8075ed append;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffbf8;
  ArgTokens *in_stack_fffffffffffffc00;
  TriviaKind local_3f1;
  Preprocessor *local_3f0;
  undefined1 local_3e1 [9];
  Token local_3d8;
  DefineDirectiveSyntax *local_3c0;
  EVP_PKEY_CTX *local_3b8;
  Info *local_3b0;
  SourceRange local_3a8;
  string_view local_398;
  ulong local_388;
  arrays_type *local_380;
  ulong local_378;
  SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax> *local_370;
  MacroFormalArgumentListSyntax *local_368;
  MacroActualArgumentListSyntax *local_360;
  SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax> *local_358;
  SmallVectorBase<slang::parsing::Trivia> local_350;
  SourceLocation local_318;
  Token local_310;
  undefined8 local_300;
  char *pcStack_2f8;
  SourceRange local_2f0;
  SmallVectorBase<slang::parsing::Token> local_2e0 [3];
  uchar local_248;
  uchar uStack_247;
  uchar uStack_246;
  byte bStack_245;
  uchar uStack_244;
  uchar uStack_243;
  uchar uStack_242;
  byte bStack_241;
  uchar uStack_240;
  uchar uStack_23f;
  uchar uStack_23e;
  byte bStack_23d;
  uchar uStack_23c;
  uchar uStack_23b;
  uchar uStack_23a;
  byte bStack_239;
  uchar local_238;
  uchar uStack_237;
  uchar uStack_236;
  byte bStack_235;
  uchar uStack_234;
  uchar uStack_233;
  uchar uStack_232;
  byte bStack_231;
  uchar uStack_230;
  uchar uStack_22f;
  uchar uStack_22e;
  byte bStack_22d;
  uchar uStack_22c;
  uchar uStack_22b;
  uchar uStack_22a;
  byte bStack_229;
  SourceLocation local_220;
  anon_class_64_8_ed10e8cd local_218;
  undefined1 local_1d8 [320];
  Storage *local_98;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
  local_90;
  anon_class_32_4_0a8075ed local_50;
  undefined6 uVar6;
  undefined5 uVar8;
  
  local_1d8._8_8_ = local_1d8._0_8_;
  pDVar25 = macro.syntax;
  if (macro.intrinsic == None) {
    if ((pDVar25->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
        _M_extent_value == 0) {
      return true;
    }
    local_3f0 = this;
    sVar50 = Token::valueText(&pDVar25->name);
    pMVar28 = pDVar25->formalArguments;
    local_3e1._1_8_ = expansion;
    if (pMVar28 != (MacroFormalArgumentListSyntax *)0x0) {
      if ((pMVar28->args).elements._M_extent._M_extent_value + 1 >> 1 <
          (actualArgs->args).elements._M_extent._M_extent_value + 1 >> 1) {
        local_1d8._0_16_ =
             (undefined1  [16])
             slang::syntax::SyntaxNode::getFirstToken(&actualArgs->super_SyntaxNode);
        SVar19 = Token::location((Token *)local_1d8);
        addDiag(local_3f0,(DiagCode)0x160004,SVar19);
        return false;
      }
      local_98 = (Storage *)local_1d8;
      local_90.arrays.groups_size_index = 0x3f;
      local_90.arrays.groups_size_mask = 1;
      local_90.arrays.elements_ = (value_type_pointer)0x0;
      local_358 = &pMVar28->args;
      local_370 = &actualArgs->args;
      local_90.arrays.groups_ =
           (group_type_pointer)
           boost::unordered::detail::foa::
           dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
           ::storage;
      local_3c0 = pDVar25;
      local_398 = sVar50;
      local_90.
      super_empty_value<slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>,_2U,_false>
      .value_.storage =
           (StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>
            )(StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>
              )local_98;
      local_90.size_ctrl.ml =
           boost::unordered::detail::foa::
           table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
           ::initial_max_load(&local_90);
      local_90.size_ctrl.size = 0;
      local_368 = pMVar28;
      local_360 = actualArgs;
      for (index = 0; index < (pMVar28->args).elements._M_extent._M_extent_value + 1 >> 1;
          index = index + 1) {
        pMVar20 = slang::syntax::SeparatedSyntaxList<slang::syntax::MacroFormalArgumentSyntax>::
                  operator[](local_358,index);
        if (index < (actualArgs->args).elements._M_extent._M_extent_value + 1 >> 1) {
          pMVar21 = slang::syntax::SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax>::
                    operator[](local_370,index);
          pTVar24 = &pMVar21->tokens;
          if (((pMVar21->tokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent
               ._M_extent_value == 0) &&
             (pMVar20->defaultValue != (MacroArgumentDefaultSyntax *)0x0)) {
            pTVar24 = &pMVar20->defaultValue->tokens;
          }
        }
        else {
          if (pMVar20->defaultValue == (MacroArgumentDefaultSyntax *)0x0) {
            SVar19 = Token::location(&actualArgs->closeParen);
            addDiag(local_3f0,(DiagCode)0x140004,SVar19);
            bVar14 = false;
            goto LAB_00264877;
          }
          pTVar24 = &pMVar20->defaultValue->tokens;
        }
        local_350._0_16_ = Token::valueText(&pMVar20->name);
        if (local_350.data_ != 0) {
          local_218.inDefineDirective =
               (bool *)(pTVar24->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_ptr;
          local_218.append =
               (anon_class_32_4_0a8075ed *)
               (pTVar24->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_extent.
               _M_extent_value;
          local_218.argumentMap =
               (SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                *)((ulong)local_218.argumentMap & 0xffffffffffffff00);
          hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            &local_90,(basic_string_view<char,_std::char_traits<char>_> *)&local_350
                           );
          arrays_ = (arrays_type *)(hash >> ((byte)local_90.arrays.groups_size_index & 0x3f));
          lVar32 = (hash & 0xff) * 4;
          uVar34 = (&UNK_004a00ac)[lVar32];
          uVar35 = (&UNK_004a00ad)[lVar32];
          uVar36 = (&UNK_004a00ae)[lVar32];
          bVar37 = (&UNK_004a00af)[lVar32];
          uVar27 = (ulong)((uint)hash & 7);
          uVar22 = 0;
          paVar26 = arrays_;
          uVar38 = uVar34;
          uVar39 = uVar35;
          uVar40 = uVar36;
          bVar41 = bVar37;
          uVar42 = uVar34;
          uVar43 = uVar35;
          uVar44 = uVar36;
          bVar45 = bVar37;
          uVar46 = uVar34;
          uVar47 = uVar35;
          uVar48 = uVar36;
          bVar49 = bVar37;
          do {
            ppVar12 = local_90.arrays.elements_;
            pgVar11 = local_90.arrays.groups_;
            pgVar1 = local_90.arrays.groups_ + (long)paVar26;
            local_238 = pgVar1->m[0].n;
            uStack_237 = pgVar1->m[1].n;
            uStack_236 = pgVar1->m[2].n;
            bStack_235 = pgVar1->m[3].n;
            uStack_234 = pgVar1->m[4].n;
            uStack_233 = pgVar1->m[5].n;
            uStack_232 = pgVar1->m[6].n;
            bStack_231 = pgVar1->m[7].n;
            uStack_230 = pgVar1->m[8].n;
            uStack_22f = pgVar1->m[9].n;
            uStack_22e = pgVar1->m[10].n;
            bStack_22d = pgVar1->m[0xb].n;
            uStack_22c = pgVar1->m[0xc].n;
            uStack_22b = pgVar1->m[0xd].n;
            uStack_22a = pgVar1->m[0xe].n;
            bVar15 = pgVar1->m[0xf].n;
            auVar33[0] = -(local_238 == uVar34);
            auVar33[1] = -(uStack_237 == uVar35);
            auVar33[2] = -(uStack_236 == uVar36);
            auVar33[3] = -(bStack_235 == bVar37);
            auVar33[4] = -(uStack_234 == uVar38);
            auVar33[5] = -(uStack_233 == uVar39);
            auVar33[6] = -(uStack_232 == uVar40);
            auVar33[7] = -(bStack_231 == bVar41);
            auVar33[8] = -(uStack_230 == uVar42);
            auVar33[9] = -(uStack_22f == uVar43);
            auVar33[10] = -(uStack_22e == uVar44);
            auVar33[0xb] = -(bStack_22d == bVar45);
            auVar33[0xc] = -(uStack_22c == uVar46);
            auVar33[0xd] = -(uStack_22b == uVar47);
            auVar33[0xe] = -(uStack_22a == uVar48);
            auVar33[0xf] = -(bVar15 == bVar49);
            uVar17 = (uint)(ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe);
            paVar13 = paVar26;
            bStack_229 = bVar15;
            if (uVar17 != 0) {
              do {
                bStack_239 = bVar49;
                uStack_23a = uVar48;
                uStack_23b = uVar47;
                uStack_23c = uVar46;
                bStack_23d = bVar45;
                uStack_23e = uVar44;
                uStack_23f = uVar43;
                uStack_240 = uVar42;
                bStack_241 = bVar41;
                uStack_242 = uVar40;
                uStack_243 = uVar39;
                uStack_244 = uVar38;
                bStack_245 = bVar37;
                uStack_246 = uVar36;
                uStack_247 = uVar35;
                local_248 = uVar34;
                local_378 = uVar22;
                local_380 = paVar13;
                local_388 = uVar27;
                uVar3 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                  }
                }
                bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)&local_90,
                                    (basic_string_view<char,_std::char_traits<char>_> *)&local_350,
                                    &ppVar12[(long)paVar26 * 0xf + (ulong)uVar3].first);
                actualArgs = local_360;
                pMVar28 = local_368;
                expansion = (MacroExpansion *)local_3e1._1_8_;
                if (bVar14) goto LAB_0026443c;
                uVar17 = uVar17 - 1 & uVar17;
                uVar27 = local_388;
                paVar13 = local_380;
                uVar22 = local_378;
                uVar34 = local_248;
                uVar35 = uStack_247;
                uVar36 = uStack_246;
                bVar37 = bStack_245;
                uVar38 = uStack_244;
                uVar39 = uStack_243;
                uVar40 = uStack_242;
                bVar41 = bStack_241;
                uVar42 = uStack_240;
                uVar43 = uStack_23f;
                uVar44 = uStack_23e;
                bVar45 = bStack_23d;
                uVar46 = uStack_23c;
                uVar47 = uStack_23b;
                uVar48 = uStack_23a;
                bVar49 = bStack_239;
              } while (uVar17 != 0);
              bVar15 = pgVar11[(long)paVar26].m[0xf].n;
              paVar26 = local_380;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[uVar27] & bVar15) == 0) break;
            lVar32 = uVar22 + 1;
            uVar22 = uVar22 + 1;
            paVar26 = (arrays_type *)
                      ((long)&paVar26->groups_size_index + lVar32 & local_90.arrays.groups_size_mask
                      );
          } while (uVar22 <= local_90.arrays.groups_size_mask);
          if (local_90.size_ctrl.size < local_90.size_ctrl.ml) {
            in_R9 = &local_218;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,320ul,16ul>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
                      ((locator *)local_2e0,&local_90.arrays,arrays_,hash,(size_t)&local_350,
                       (try_emplace_args_t *)in_R9,in_stack_fffffffffffffbf8,
                       in_stack_fffffffffffffc00);
            local_90.size_ctrl.size = local_90.size_ctrl.size + 1;
            actualArgs = local_360;
            pMVar28 = local_368;
            expansion = (MacroExpansion *)local_3e1._1_8_;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,320ul,16ul>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
                      ((locator *)local_2e0,&local_90,hash,(try_emplace_args_t *)&local_350,
                       (basic_string_view<char,_std::char_traits<char>_> *)&local_218,
                       (ArgTokens *)in_R9);
            actualArgs = local_360;
            pMVar28 = local_368;
            expansion = (MacroExpansion *)local_3e1._1_8_;
          }
        }
LAB_0026443c:
      }
      local_310 = slang::syntax::SyntaxNode::getLastToken(&actualArgs->super_SyntaxNode);
      SVar51 = MacroExpansion::getRange(expansion);
      SVar19 = Token::location(&local_310);
      sVar50 = Token::rawText(&local_310);
      local_3a8.endLoc = (SourceLocation)(sVar50._M_len * 0x10000000 + (long)SVar19);
      local_3a8.startLoc = SVar51.startLoc;
      local_318 = Token::location((local_3c0->body).
                                  super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr);
      pPVar10 = local_3f0;
      SVar51.endLoc = local_3a8.endLoc;
      SVar51.startLoc = local_3a8.startLoc;
      local_220 = SourceManager::createExpansionLoc
                            (local_3f0->sourceManager,local_318,SVar51,local_398);
      local_218.expansionLoc = &local_220;
      local_218.append = &local_50;
      local_218.start = &local_318;
      local_218.expansionRange = &local_3a8;
      local_218.inDefineDirective = (bool *)local_3e1;
      local_3e1[0] = Unknown;
      local_218.argumentMap =
           (SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
            *)local_1d8;
      local_218.this = pPVar10;
      pTVar31 = (local_3c0->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
      pTVar29 = pTVar31 + (local_3c0->body).
                          super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
                          _M_extent_value;
      local_218.expansion = expansion;
      local_50.expansion = expansion;
      local_50.expansionLoc = local_218.expansionLoc;
      local_50.start = local_218.start;
      local_50.expansionRange = local_218.expansionRange;
      do {
        bVar14 = pTVar31 == pTVar29;
        if (bVar14) {
LAB_00264877:
          SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
          ::~SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_320UL,_16UL>_>
                       *)local_1d8);
          return bVar14;
        }
        uVar4 = pTVar31->kind;
        uVar5 = pTVar31->field_0x2;
        uVar7 = pTVar31->numFlags;
        uVar9 = pTVar31->rawLen;
        uVar8 = CONCAT41(uVar9,uVar7);
        uVar6 = CONCAT51(uVar8,uVar5);
        local_3d8.info = pTVar31->info;
        local_3d8.kind = uVar4;
        local_3d8._2_6_ = uVar6;
        if (((uVar4 == Identifier) && (sVar50 = Token::rawText(&local_3d8), sVar50._M_len != 0)) &&
           (sVar50 = Token::rawText(&local_3d8), *sVar50._M_str == '\\')) {
          local_2e0[0]._0_16_ = (undefined1  [16])Token::rawText(&local_3d8);
          __n = std::basic_string_view<char,_std::char_traits<char>_>::find
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_2e0,"``",0);
          if (__n == 0xffffffffffffffff) goto LAB_002646d7;
          pBVar2 = local_3f0->alloc;
          local_2e0[0]._0_16_ = (undefined1  [16])Token::rawText(&local_3d8);
          rawText = std::basic_string_view<char,_std::char_traits<char>_>::substr
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_2e0,0,__n);
          TVar52 = Token::withRawText(&local_3d8,pBVar2,rawText);
          bVar16 = expandMacro::anon_class_64_8_ed10e8cd::operator()(&local_218,TVar52);
          if (!bVar16) goto LAB_00264877;
          local_2e0[0].len = 0;
          local_2e0[0].data_ = (pointer)local_2e0[0].firstElement;
          local_2e0[0].cap = 8;
          ctx = (EVP_PKEY_CTX *)CONCAT62(local_3d8._2_6_,local_3d8.kind);
          sourceToken._2_1_ = local_3d8._2_1_;
          sourceToken.numFlags.raw = local_3d8.numFlags.raw;
          sourceToken.rawLen = local_3d8.rawLen;
          sourceToken.kind = local_3d8.kind;
          sourceToken.info = local_3d8.info;
          splitTokens(local_3f0,sourceToken,__n,local_2e0);
          lVar32 = local_2e0[0].len << 4;
          pTVar23 = local_2e0[0].data_;
          while (lVar32 != 0) {
            ctx = *(EVP_PKEY_CTX **)pTVar23;
            bVar16 = expandMacro::anon_class_64_8_ed10e8cd::operator()(&local_218,*pTVar23);
            pTVar23 = pTVar23 + 1;
            lVar32 = lVar32 + -0x10;
            if (!bVar16) goto LAB_0026486a;
          }
          if ((char *)local_2e0[0].len != (char *)0x0) {
            local_350.len = 0;
            local_350.data_ = (pointer)local_350.firstElement;
            local_350.cap = 2;
            local_3f1 = Whitespace;
            local_3b8 = (EVP_PKEY_CTX *)0x1;
            local_3b0 = (Info *)0x4d4aee;
            SmallVectorBase<slang::parsing::Trivia>::
            emplace_back<slang::parsing::TriviaKind,std::basic_string_view<char,std::char_traits<char>>>
                      (&local_350,&local_3f1,
                       (basic_string_view<char,_std::char_traits<char>_> *)&local_3b8);
            local_3e1._1_8_ = Token::location(local_2e0[0].data_ + (long)(local_2e0[0].len + -1));
            pPVar10 = local_3f0;
            sVar50 = Token::rawText(local_2e0[0].data_ + (long)(local_2e0[0].len + -1));
            pBVar2 = pPVar10->alloc;
            iVar18 = SmallVectorBase<slang::parsing::Trivia>::copy
                               (&local_350,(EVP_PKEY_CTX *)pBVar2,(EVP_PKEY_CTX *)sVar50._M_str);
            trivia._M_ptr._4_4_ = extraout_var;
            trivia._M_ptr._0_4_ = iVar18;
            local_300 = 0;
            pcStack_2f8 = "";
            trivia._M_extent._M_extent_value = extraout_RDX._M_extent_value;
            Token::Token((Token *)&local_3b8,pBVar2,EmptyMacroArgument,trivia,
                         (string_view)(ZEXT816(0x489e8d) << 0x40),
                         (SourceLocation)(sVar50._M_len * 0x10000000 + local_3e1._1_8_));
            token_00.info = local_3b0;
            token_00._0_8_ = local_3b8;
            ctx = local_3b8;
            bVar16 = expandMacro::anon_class_64_8_ed10e8cd::operator()(&local_218,token_00);
            SmallVectorBase<slang::parsing::Trivia>::cleanup(&local_350,ctx);
            if (!bVar16) {
LAB_0026486a:
              SmallVectorBase<slang::parsing::Token>::cleanup(local_2e0,ctx);
              goto LAB_00264877;
            }
          }
          SmallVectorBase<slang::parsing::Token>::cleanup(local_2e0,ctx);
        }
        else {
LAB_002646d7:
          TVar52._2_1_ = local_3d8._2_1_;
          TVar52.numFlags.raw = local_3d8.numFlags.raw;
          TVar52.rawLen = local_3d8.rawLen;
          TVar52.kind = local_3d8.kind;
          TVar52.info = local_3d8.info;
          bVar16 = expandMacro::anon_class_64_8_ed10e8cd::operator()(&local_218,TVar52);
          if (!bVar16) goto LAB_00264877;
        }
        pTVar31 = pTVar31 + 1;
      } while( true );
    }
    SVar19 = Token::location((pDVar25->body).
                             super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr);
    local_1d8._0_8_ = SVar19;
    this_00 = local_3f0->sourceManager;
    SVar51 = MacroExpansion::getRange(expansion);
    local_2e0[0].data_ = (pointer)SourceManager::createExpansionLoc(this_00,SVar19,SVar51,sVar50);
    this_01 = local_3e1._1_8_;
    pTVar30 = (pDVar25->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
    for (lVar32 = (pDVar25->body).super_span<slang::parsing::Token,_18446744073709551615UL>.
                  _M_extent._M_extent_value << 4; lVar32 != 0; lVar32 = lVar32 + -0x10) {
      TVar52 = *pTVar30;
      local_2f0 = MacroExpansion::getRange((MacroExpansion *)this_01);
      MacroExpansion::append
                ((MacroExpansion *)this_01,TVar52,(SourceLocation *)local_2e0,
                 (SourceLocation *)local_1d8,local_2f0,false);
      pTVar30 = pTVar30 + 1;
    }
  }
  else {
    expandIntrinsic(this,macro.intrinsic,expansion);
  }
  return true;
}

Assistant:

bool Preprocessor::expandMacro(MacroDef macro, MacroExpansion& expansion,
                               MacroActualArgumentListSyntax* actualArgs) {
    if (macro.isIntrinsic()) {
        // for now, no intrisics can have arguments
        SLANG_ASSERT(!actualArgs);
        return expandIntrinsic(macro.intrinsic, expansion);
    }

    const DefineDirectiveSyntax* directive = macro.syntax;
    SLANG_ASSERT(directive);

    // ignore empty macro
    const auto& body = directive->body;
    if (body.empty())
        return true;

    std::string_view macroName = directive->name.valueText();

    if (!directive->formalArguments) {
        // each macro expansion gets its own location entry
        SourceLocation start = body[0].location();
        SourceLocation expansionLoc = sourceManager.createExpansionLoc(start, expansion.getRange(),
                                                                       macroName);

        // simple macro; just take body tokens
        for (auto token : body)
            expansion.append(token, expansionLoc, start, expansion.getRange());

        return true;
    }

    // match up actual arguments with formal parameters
    SLANG_ASSERT(actualArgs);
    auto& formalList = directive->formalArguments->args;
    auto& actualList = actualArgs->args;
    if (actualList.size() > formalList.size()) {
        addDiag(diag::TooManyActualMacroArgs, actualArgs->getFirstToken().location());
        return false;
    }

    struct ArgTokens : public std::span<const Token> {
        using std::span<const Token>::span;
        using std::span<const Token>::operator=;
        bool isExpanded = false;
    };
    SmallMap<std::string_view, ArgTokens, 8> argumentMap;

    for (size_t i = 0; i < formalList.size(); i++) {
        auto formal = formalList[i];
        const TokenList* tokenList = nullptr;
        if (actualList.size() > i) {
            // if our actual argument is empty and we have a default, take that
            tokenList = &actualList[i]->tokens;
            if (tokenList->empty() && formal->defaultValue)
                tokenList = &formal->defaultValue->tokens;
        }
        else {
            // if we've run out of actual args make sure we have a default for this one
            if (formal->defaultValue)
                tokenList = &formal->defaultValue->tokens;
            else {
                addDiag(diag::NotEnoughMacroArgs, actualArgs->closeParen.location());
                return false;
            }
        }

        auto name = formal->name.valueText();
        if (!name.empty())
            argumentMap.emplace(name, ArgTokens(*tokenList));
    }

    Token endOfArgs = actualArgs->getLastToken();
    SourceRange expansionRange(expansion.getRange().start(),
                               endOfArgs.location() + endOfArgs.rawText().length());

    SourceLocation start = body[0].location();
    SourceLocation expansionLoc = sourceManager.createExpansionLoc(start, expansionRange,
                                                                   macroName);

    auto append = [&](Token token) {
        expansion.append(token, expansionLoc, start, expansionRange);
        return true;
    };

    bool inDefineDirective = false;

    auto handleToken = [&](Token token) {
        if (inDefineDirective && !token.isOnSameLine())
            inDefineDirective = false;

        if (token.kind != TokenKind::Identifier && !LF::isKeyword(token.kind) &&
            token.kind != TokenKind::Directive) {
            // Non-identifier, can't be argument substituted.
            return append(token);
        }

        std::string_view text = token.valueText();
        if (token.kind == TokenKind::Directive && !text.empty()) {
            if (token.directiveKind() != SyntaxKind::MacroUsage) {
                // If this is the start of a `define directive, note that fact because
                // during argument expansion we will insert line continuations.
                if (token.directiveKind() == SyntaxKind::DefineDirective)
                    inDefineDirective = true;
                return append(token);
            }

            // Other tools allow arguments to replace matching directive names, e.g.:
            // `define FOO(bar) `bar
            // `define ONE 1
            // `FOO(ONE)   // expands to 1
            text = text.substr(1);
        }

        // check for formal param
        auto it = argumentMap.find(text);
        if (it == argumentMap.end())
            return append(token);

        // Fully expand out arguments before substitution to make sure we can detect whether
        // a usage of a macro in a replacement list is valid or an illegal recursion.
        if (!it->second.isExpanded) {
            std::span<const Token> argTokens = it->second;
            SmallSet<const DefineDirectiveSyntax*, 8> alreadyExpanded;
            if (!expandReplacementList(argTokens, alreadyExpanded))
                return false;

            it->second = argTokens;
            it->second.isExpanded = true;
        }

        auto begin = it->second.begin();
        auto end = it->second.end();
        if (begin == end) {
            // The macro argument contained no tokens. We still need to supply an empty token
            // here to ensure that the trivia of the formal parameter is passed on.
            Token empty(alloc, TokenKind::EmptyMacroArgument, token.trivia(), ""sv,
                        token.location());
            return append(empty);
        }

        // We need to ensure that we get correct spacing for the leading token here;
        // it needs to come from the *formal* parameter used in the macro body, not
        // from the argument itself.
        Token first = begin->withTrivia(alloc, token.trivia());
        SourceLocation firstLoc = first.location();

        // Arguments need their own expansion location created; the original
        // location comes from the source file itself, and the expansion location
        // points into the macro body where the formal argument was used.
        SourceLocation tokenLoc = expansion.adjustLoc(token, expansionLoc, start, expansionRange);
        SourceRange argRange(tokenLoc, tokenLoc + token.rawText().length());
        SourceLocation argLoc = sourceManager.createExpansionLoc(firstLoc, argRange, true);

        // See note above about weird macro usage being argument replaced.
        // In that case we want to fabricate the correct directive token here.
        if (token.kind == TokenKind::Directive) {
            Token grave(alloc, TokenKind::Unknown, first.trivia(), "`"sv, firstLoc);
            Token combined = Lexer::concatenateTokens(alloc, sourceManager, grave, first);
            if (combined) {
                first = combined;
            }
            else {
                // Failed to combine, so ignore the grave and issue an error.
                addDiag(diag::MisplacedDirectiveChar, firstLoc);
            }
        }

        if (inDefineDirective) {
            // Inside a define directive we need to insert line continuations
            // any time an expanded token will end up on a new line.
            auto appendBody = [&](Token token) {
                if (!token.isOnSameLine()) {
                    Token lc(alloc, TokenKind::LineContinuation, token.trivia(), "\\"sv,
                             token.location());
                    expansion.append(lc, argLoc, firstLoc, argRange,
                                     /* allowLineContinuation */ true);

                    token = token.withTrivia(alloc, {});
                }
                expansion.append(token, argLoc, firstLoc, argRange);
            };

            appendBody(first);
            for (++begin; begin != end; begin++)
                appendBody(*begin);
        }
        else {
            expansion.append(first, argLoc, firstLoc, argRange);
            for (++begin; begin != end; begin++)
                expansion.append(*begin, argLoc, firstLoc, argRange);
        }

        return true;
    };

    // Now add each body token, substituting arguments as necessary.
    for (auto token : body) {
        if (token.kind == TokenKind::Identifier && !token.rawText().empty() &&
            token.rawText()[0] == '\\') {
            // Escaped identifier, might need to break apart and substitute
            // individual pieces of it.
            size_t index = token.rawText().find("``");
            if (index != std::string_view::npos) {
                Token first = token.withRawText(alloc, token.rawText().substr(0, index));
                if (!handleToken(first))
                    return false;

                SmallVector<Token, 8> splits;
                splitTokens(token, index, splits);
                for (auto t : splits) {
                    if (!handleToken(t))
                        return false;
                }

                // Add an empty argument in here so we can make sure a space ends
                // the escaped identifier once it gets concatenated again.
                if (!splits.empty()) {
                    SmallVector<Trivia> triviaBuf;
                    triviaBuf.emplace_back(TriviaKind::Whitespace, " "sv);

                    auto loc = splits.back().location() + splits.back().rawText().length();
                    Token empty(alloc, TokenKind::EmptyMacroArgument, triviaBuf.copy(alloc), ""sv,
                                loc);

                    if (!handleToken(empty))
                        return false;
                }

                continue;
            }
        }

        if (!handleToken(token))
            return false;
    }

    return true;
}